

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void Cffgprh(fitsfile *fptr,int *simple,int *bitpix,int *naxis,int *naxes,long *pcount,long *gcount,
            int *extend,int *status)

{
  long local_50;
  long size;
  long *LONGnaxes;
  long *pcount_local;
  int *naxes_local;
  int *naxis_local;
  int *bitpix_local;
  int *simple_local;
  fitsfile *fptr_local;
  
  LONGnaxes = pcount;
  pcount_local = (long *)naxes;
  naxes_local = naxis;
  naxis_local = bitpix;
  bitpix_local = simple;
  simple_local = &fptr->HDUposition;
  ffgkyj(fptr,"NAXIS",&local_50,(char *)0x0,status);
  size = (long)F2Clongv(local_50,(int *)pcount_local);
  ffghpr((fitsfile *)simple_local,(int)local_50,bitpix_local,naxis_local,naxes_local,(long *)size,
         LONGnaxes,gcount,extend,status);
  C2Flongv(local_50,(int *)pcount_local,(long *)size);
  return;
}

Assistant:

void Cffgprh( fitsfile *fptr, int *simple, int *bitpix, int *naxis, int naxes[],
             long *pcount, long *gcount, int *extend, int *status )
{
   long *LONGnaxes, size;

   ffgkyj( fptr, "NAXIS", &size, 0, status );
   LONGnaxes = F2Clongv(size,naxes);
   ffghpr( fptr, (int)size, simple, bitpix, naxis, LONGnaxes,
           pcount, gcount, extend, status );
   C2Flongv(size,naxes,LONGnaxes);
}